

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 00-readme.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  ostream *poVar2;
  Grid<float,_4UL,_2UL,_3UL> grid;
  char local_89;
  Grid<float,_4UL,_2UL,_3UL> local_88;
  
  local_88.values_.data_[0x14] = 0.0;
  local_88.values_.data_[0x15] = 0.0;
  local_88.values_.data_[0x16] = 0.0;
  local_88.values_.data_[0x17] = 0.0;
  local_88.values_.data_[0x10] = 0.0;
  local_88.values_.data_[0x11] = 0.0;
  local_88.values_.data_[0x12] = 0.0;
  local_88.values_.data_[0x13] = 0.0;
  local_88.values_.data_[0xc] = 0.0;
  local_88.values_.data_[0xd] = 0.0;
  local_88.values_.data_[0xe] = 0.0;
  local_88.values_.data_[0xf] = 0.0;
  local_88.values_.data_[8] = 0.0;
  local_88.values_.data_[9] = 0.0;
  local_88.values_.data_[10] = 0.0;
  local_88.values_.data_[0xb] = 0.0;
  local_88.values_.data_[4] = 0.0;
  local_88.values_.data_[5] = 0.0;
  local_88.values_.data_[6] = 0.0;
  local_88.values_.data_[7] = 0.0;
  local_88.values_.data_[0] = 0.0;
  local_88.values_.data_[1] = 0.0;
  local_88.values_.data_[2] = 0.0;
  local_88.values_.data_[3] = 0.0;
  lVar1 = 0;
  do {
    main::$_0::operator()()::n = main::$_0::operator()()::n + 0.5;
    *(float *)((long)local_88.values_.data_ + lVar1) = main::$_0::operator()()::n;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x60);
  poVar2 = multidim::_impl_multi_grid::operator<<((ostream *)&std::cout,&local_88);
  local_89 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_89,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"grid[{{2,0,2}}] = ",0x12);
  poVar2 = std::ostream::_M_insert<double>((double)local_88.values_.data_[0xe]);
  local_89 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_89,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"grid.flatten({{2,0,2}}) =",0x19);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_89 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_89,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"grid.unflatten(14) = {",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  return 0;
}

Assistant:

int main() 
{
	// Create a 3D grid with 4x2x3 vertices
	multidim::Grid<float,4,2,3> grid;

	// grid behaves like a STL container and we can fill values with std::generate
	std::generate(grid.begin(), grid.end(), [](){ static float n{0.0f}; return n+=0.5f; } );

	// We have a pretty printer
	std::cout << grid << '\n';

	// We can access efficiently to values from appropriate coordinates
	std::cout << "grid[{{2,0,2}}] = " << grid[{{2,0,2}}] << '\n';

    // Access to indexes or coords are O(1)
    std::cout << "grid.flatten({{2,0,2}}) =" << grid.flatten({{2,0,2}}) << '\n';

    // Indeed it is evaluated at compile time !
    static_assert(grid.flatten({{2,0,2}}) == 14, "Should be evaluated at compile time !");

    constexpr auto coord = grid.unflatten(14);
    std::cout << "grid.unflatten(14) = {" << coord[0] << "," << coord[1] << "," << coord[2] << "}\n";
    static_assert(coord[0] == 2, "Should be evaluated at compile time !");
}